

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureWrapClampToBorderCase::test
          (TextureWrapClampToBorderCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  string local_c0;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  code *local_40;
  GLenum local_38;
  
  glu::CallLogWrapper::glTexParameteri
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x812d);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_40);
    uVar6 = 0xf;
    if (local_a0 != local_90) {
      uVar6 = local_90[0];
    }
    if (uVar6 < local_c0._M_string_length + local_98) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        uVar7 = local_c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_c0._M_string_length + local_98) goto LAB_00922cbb;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
    }
    else {
LAB_00922cbb:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    }
    local_e0 = &local_d0;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_d0 = *plVar3;
      uStack_c8 = puVar2[3];
    }
    else {
      local_d0 = *plVar3;
      local_e0 = (long *)*puVar2;
    }
    local_d8 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar3[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60.field_2._8_8_ = plVar3[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_60._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x812d,
             (this->super_TextureTest).m_type);
  glu::CallLogWrapper::glTexParameteri
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x2901);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_40);
    uVar6 = 0xf;
    if (local_a0 != local_90) {
      uVar6 = local_90[0];
    }
    if (uVar6 < local_c0._M_string_length + local_98) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        uVar7 = local_c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_c0._M_string_length + local_98) goto LAB_00922f30;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
    }
    else {
LAB_00922f30:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
    }
    local_e0 = &local_d0;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_d0 = *plVar3;
      uStack_c8 = puVar2[3];
    }
    else {
      local_d0 = *plVar3;
      local_e0 = (long *)*puVar2;
    }
    local_d8 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar3[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60.field_2._8_8_ = plVar3[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_60._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::ResultCollector::fail(result,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
  }
  glu::CallLogWrapper::glTexParameterf
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,33069.0);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 == 0) goto LAB_00923330;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Got Error ","");
  local_40 = glu::getErrorName;
  local_38 = GVar1;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c0,&local_40);
  uVar6 = 0xf;
  if (local_a0 != local_90) {
    uVar6 = local_90[0];
  }
  if (uVar6 < local_c0._M_string_length + local_98) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      uVar7 = local_c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_c0._M_string_length + local_98) goto LAB_00923188;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_00923188:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
  }
  local_e0 = &local_d0;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_d0 = *plVar3;
    uStack_c8 = puVar2[3];
  }
  else {
    local_d0 = *plVar3;
    local_e0 = (long *)*puVar2;
  }
  local_d8 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_70 = *plVar4;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_60.field_2._M_allocated_capacity = *psVar5;
    local_60.field_2._8_8_ = plVar3[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar5;
    local_60._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_60._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  tcu::ResultCollector::fail(result,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
LAB_00923330:
  StateQueryUtil::verifyStateTextureParamInteger
            (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x812d,
             (this->super_TextureTest).m_type);
  return;
}

Assistant:

void TextureWrapClampToBorderCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	gl.glTexParameteri(m_target, m_pname, GL_CLAMP_TO_BORDER_EXT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");
	verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_CLAMP_TO_BORDER_EXT, m_type);

	gl.glTexParameteri(m_target, m_pname, GL_REPEAT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

	gl.glTexParameterf(m_target, m_pname, (GLfloat)GL_CLAMP_TO_BORDER_EXT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

	verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_CLAMP_TO_BORDER_EXT, m_type);
}